

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_debug_scaling_list
               (bs_t *b,int *scalingList,int sizeOfScalingList,int *useDefaultScalingMatrixFlag)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  FILE *pFVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  
  if (0 < sizeOfScalingList) {
    iVar12 = 8;
    uVar6 = 0;
    iVar3 = 8;
    do {
      if (iVar3 == 0) {
        iVar3 = 0;
      }
      else {
        pFVar8 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar8 = _stdout;
        }
        fprintf(pFVar8,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
        pbVar5 = b->p;
        pbVar1 = b->end;
        uVar7 = b->bits_left;
        uVar2 = 0xffffffff;
        iVar3 = -2;
        do {
          iVar9 = iVar3;
          uVar4 = uVar2;
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          bVar13 = true;
          if (pbVar5 < pbVar1) {
            bVar13 = (*pbVar5 >> (uVar7 & 0x1f) & 1) == 0;
          }
          if (uVar7 == 0) {
            pbVar5 = pbVar5 + 1;
            b->p = pbVar5;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar2 = uVar4 + 1;
        } while (((bool)(bVar13 & uVar2 < 0x20)) && (iVar3 = iVar9 + 1, pbVar5 < pbVar1));
        uVar10 = 0;
        if (uVar2 != 0) {
          do {
            uVar7 = uVar7 - 1;
            b->bits_left = uVar7;
            uVar11 = 0;
            if (pbVar5 < pbVar1) {
              uVar11 = (uint)((*pbVar5 >> (uVar7 & 0x1f) & 1) != 0);
            }
            if (uVar7 == 0) {
              pbVar5 = pbVar5 + 1;
              b->p = pbVar5;
              b->bits_left = 8;
              uVar7 = 8;
            }
            uVar10 = uVar10 | uVar11 << ((byte)uVar4 & 0x1f);
            uVar4 = uVar4 - 1;
            iVar9 = iVar9 + -1;
          } while (iVar9 != -2);
        }
        uVar4 = -1 << ((byte)uVar2 & 0x1f);
        uVar2 = ~uVar4 + uVar10;
        uVar7 = -((int)uVar2 >> 1);
        if ((uVar2 & 1) != 0) {
          uVar7 = (int)(uVar10 - uVar4) >> 1;
        }
        pFVar8 = (FILE *)h264_dbgfile;
        if (h264_dbgfile == (FILE *)0x0) {
          pFVar8 = _stdout;
        }
        fprintf(pFVar8,"delta_scale: %d \n",(ulong)uVar7);
        uVar2 = iVar12 + 0x100 + uVar7;
        uVar7 = iVar12 + 0x1ff + uVar7;
        if (-1 < (int)uVar2) {
          uVar7 = uVar2;
        }
        iVar3 = uVar2 - (uVar7 & 0xffffff00);
        if (iVar3 != 0) {
          iVar12 = iVar3;
        }
        *useDefaultScalingMatrixFlag = (uint)(iVar3 == 0 && uVar6 == 0);
      }
      scalingList[uVar6] = iVar12;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)sizeOfScalingList);
  }
  return;
}

Assistant:

void read_debug_scaling_list(bs_t* b, int* scalingList, int sizeOfScalingList, int* useDefaultScalingMatrixFlag )
{
    // NOTE need to be able to set useDefaultScalingMatrixFlag when reading, hence passing as pointer
    int lastScale = 8;
    int nextScale = 8;
    int delta_scale;
    for( int j = 0; j < sizeOfScalingList; j++ )
    {
        if( nextScale != 0 )
        {
            if( 0 )
            {
                nextScale = scalingList[ j ];
                if (useDefaultScalingMatrixFlag[0]) { nextScale = 0; }
                delta_scale = (nextScale - lastScale) % 256 ;
            }

            printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); delta_scale = bs_read_se(b); printf("delta_scale: %d \n", delta_scale); 

            if( 1 )
            {
                nextScale = ( lastScale + delta_scale + 256 ) % 256;
                useDefaultScalingMatrixFlag[0] = ( j == 0 && nextScale == 0 );
            }
        }
        if( 1 )
        {
            scalingList[ j ] = ( nextScale == 0 ) ? lastScale : nextScale;
        }
        lastScale = scalingList[ j ];
    }
}